

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubD_ComponentIdTypeAndTag
ON_SubD_ComponentIdTypeAndTag::CreateFromEdgeId
          (uint edge_id,ON_SubDEdgeTag etag,ON_SubDEdgeSharpness sharpness)

{
  ON_SubDEdgeTag OVar1;
  bool bVar2;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  ON_SubD_ComponentIdTypeAndTag OVar3;
  ON_SubDEdgeSharpness local_40;
  undefined1 local_38 [16];
  ON_SubD_ComponentIdTypeAndTag local_28;
  undefined1 local_18 [16];
  
  local_18._8_4_ = in_XMM0_Dc;
  local_18._0_8_ = sharpness.m_edge_sharpness;
  local_18._12_4_ = in_XMM0_Dd;
  local_40.m_edge_sharpness = sharpness.m_edge_sharpness;
  OVar3 = CreateFromEdgeId(edge_id,etag);
  local_38._0_4_ = OVar3.m_sharpness.m_edge_sharpness[0];
  local_38._4_4_ = OVar3.m_sharpness.m_edge_sharpness[1];
  local_28.m_sharpness = OVar3.m_sharpness.m_edge_sharpness;
  if ((OVar3._8_8_ & 0xff00000000) == 0x400000000) {
    local_38._8_4_ = extraout_XMM0_Dc;
    local_38._0_4_ = local_28.m_sharpness.m_edge_sharpness[0];
    local_38._4_4_ = local_28.m_sharpness.m_edge_sharpness[1];
    local_38._12_4_ = extraout_XMM0_Dd;
    local_28._8_8_ = OVar3._8_8_;
    OVar1 = EdgeTag(&local_28);
    if ((OVar1 == SmoothX) || (OVar1 == Smooth)) {
      bVar2 = ON_SubDEdgeSharpness::IsSharp(&local_40);
      if (bVar2) {
        local_38._0_4_ = local_18._0_4_;
        local_38._4_4_ = local_18._4_4_;
      }
    }
    else {
    }
  }
  OVar3.m_sharpness.m_edge_sharpness[1] = (float)local_38._4_4_;
  OVar3.m_sharpness.m_edge_sharpness[0] = (float)local_38._0_4_;
  return OVar3;
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdgeId(unsigned edge_id, ON_SubDEdgeTag etag, ON_SubDEdgeSharpness sharpness)
{
  ON_SubD_ComponentIdTypeAndTag itt = CreateFromEdgeId(edge_id, etag);
  if (ON_SubDComponentPtr::Type::Edge == itt.m_type)
  {
    switch (itt.EdgeTag())
    {
    case ON_SubDEdgeTag::Smooth:
    case ON_SubDEdgeTag::SmoothX:
      if (sharpness.IsSharp())
        itt.m_sharpness = sharpness;
      break;
    default:
      break;
    }
  }
  return itt;
}